

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

Object<cmCMakePresetsGraph::ConfigurePreset> * __thiscall
cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>::
Bind<cmCMakePresetsGraph::ConfigurePreset,std::optional<cmTraceEnums::TraceOutputFormat>,bool(*)(std::optional<cmTraceEnums::TraceOutputFormat>&,Json::Value_const*,cmJSONState*)>
          (Object<cmCMakePresetsGraph::ConfigurePreset> *this,string_view *name,
          offset_in_ConfigurePreset_to_optional<cmTraceEnums::TraceOutputFormat> member,
          _func_bool_optional<cmTraceEnums::TraceOutputFormat>_ptr_Value_ptr_cmJSONState_ptr *func,
          bool required)

{
  Object<cmCMakePresetsGraph::ConfigurePreset> *pOVar1;
  anon_class_16_2_47de0b2f local_60;
  MemberFunction local_50;
  byte local_29;
  _func_bool_optional<cmTraceEnums::TraceOutputFormat>_ptr_Value_ptr_cmJSONState_ptr *p_Stack_28;
  bool required_local;
  _func_bool_optional<cmTraceEnums::TraceOutputFormat>_ptr_Value_ptr_cmJSONState_ptr *func_local;
  offset_in_ConfigurePreset_to_optional<cmTraceEnums::TraceOutputFormat> member_local;
  string_view *name_local;
  Object<cmCMakePresetsGraph::ConfigurePreset> *this_local;
  
  local_60.func = func;
  local_60.member = member;
  local_29 = required;
  p_Stack_28 = func;
  func_local = (_func_bool_optional<cmTraceEnums::TraceOutputFormat>_ptr_Value_ptr_cmJSONState_ptr *
               )member;
  member_local = (offset_in_ConfigurePreset_to_optional<cmTraceEnums::TraceOutputFormat>)name;
  name_local = (string_view *)this;
  std::function<bool(cmCMakePresetsGraph::ConfigurePreset&,Json::Value_const*,cmJSONState*)>::
  function<cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>::Bind<cmCMakePresetsGraph::ConfigurePreset,std::optional<cmTraceEnums::TraceOutputFormat>,bool(*)(std::optional<cmTraceEnums::TraceOutputFormat>&,Json::Value_const*,cmJSONState*)>(std::basic_string_view<char,std::char_traits<char>>const&,std::optional<cmTraceEnums::TraceOutputFormat>cmCMakePresetsGraph::ConfigurePreset::*,bool(*)(std::optional<cmTraceEnums::TraceOutputFormat>&,Json::Value_const*,cmJSONState*),bool)::_lambda(cmCMakePresetsGraph::ConfigurePreset&,Json::Value_const*,cmJSONState*)_1_,void>
            ((function<bool(cmCMakePresetsGraph::ConfigurePreset&,Json::Value_const*,cmJSONState*)>
              *)&local_50,&local_60);
  pOVar1 = BindPrivate(this,name,&local_50,(bool)(local_29 & 1));
  std::function<bool_(cmCMakePresetsGraph::ConfigurePreset_&,_const_Json::Value_*,_cmJSONState_*)>::
  ~function(&local_50);
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, M U::*member, F func,
                 bool required = true)
    {
      return this->BindPrivate(
        name,
        [func, member](T& out, const Json::Value* value, cmJSONState* state)
          -> bool { return func(out.*member, value, state); },
        required);
    }